

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF.cc
# Opt level: O0

QPDFObjectHandle __thiscall
QPDF::replaceForeignIndirectObjects
          (QPDF *this,QPDFObjectHandle *foreign,ObjCopier *obj_copier,bool top)

{
  type *ptVar1;
  bool bVar2;
  qpdf_object_type_e qVar3;
  pointer ppVar4;
  mapped_type *pmVar5;
  logic_error *this_00;
  undefined7 in_register_00000009;
  map<QPDFObjGen,_QPDFObjectHandle,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFObjectHandle>_>_>
  *this_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_06;
  byte in_R8B;
  QPDFObjectHandle QVar7;
  QPDFObjectHandle local_1f0;
  QPDFObjectHandle local_1e0;
  undefined1 local_1d0 [32];
  _Base_ptr local_1b0;
  type *value_1;
  type *key_1;
  _Self local_198;
  iterator __end5;
  iterator __begin5;
  Dictionary *__range5;
  QPDFObjectHandle old_dict;
  QPDFObjectHandle dict;
  undefined1 local_148 [32];
  _Base_ptr local_128;
  type *value;
  type *key;
  _Self local_110;
  iterator __end4;
  iterator __begin4;
  Dictionary *__range4;
  undefined1 local_d8 [32];
  _Base_ptr local_b8;
  QPDFObjectHandle *item;
  iterator __end3;
  iterator __begin3;
  Array *__range3;
  QPDFObjectHandle local_70;
  _Self local_60;
  QPDFObjGen local_58;
  _Self local_50;
  iterator mapping;
  qpdf_object_type_e foreign_tc;
  bool top_local;
  ObjCopier *obj_copier_local;
  QPDFObjectHandle *foreign_local;
  QPDF *this_local;
  QPDFObjectHandle *result;
  
  this_01 = (map<QPDFObjGen,_QPDFObjectHandle,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFObjectHandle>_>_>
             *)CONCAT71(in_register_00000009,top);
  qVar3 = QPDFObjectHandle::getTypeCode((QPDFObjectHandle *)obj_copier);
  QPDFObjectHandle::QPDFObjectHandle((QPDFObjectHandle *)this);
  if (((in_R8B & 1) == 0) &&
     (bVar2 = QPDFObjectHandle::isIndirect((QPDFObjectHandle *)obj_copier), bVar2)) {
    QTC::TC("qpdf","QPDF replace indirect",0);
    local_58 = QPDFObjectHandle::getObjGen((QPDFObjectHandle *)obj_copier);
    local_50._M_node =
         (_Base_ptr)
         std::
         map<QPDFObjGen,_QPDFObjectHandle,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFObjectHandle>_>_>
         ::find(this_01,&local_58);
    local_60._M_node =
         (_Base_ptr)
         std::
         map<QPDFObjGen,_QPDFObjectHandle,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFObjectHandle>_>_>
         ::end(this_01);
    bVar2 = std::operator==(&local_50,&local_60);
    if (bVar2) {
      QTC::TC("qpdf","QPDF replace foreign indirect with null",0);
      QPDFObjectHandle::newNull();
      QPDFObjectHandle::operator=((QPDFObjectHandle *)this,&local_70);
      QPDFObjectHandle::~QPDFObjectHandle(&local_70);
      _Var6._M_pi = extraout_RDX;
    }
    else {
      ppVar4 = std::_Rb_tree_iterator<std::pair<const_QPDFObjGen,_QPDFObjectHandle>_>::operator->
                         (&local_50);
      QPDFObjectHandle::operator=((QPDFObjectHandle *)this,&ppVar4->second);
      _Var6._M_pi = extraout_RDX_00;
    }
  }
  else if (qVar3 == ot_array) {
    QTC::TC("qpdf","QPDF replace array",0);
    QPDFObjectHandle::newArray();
    QPDFObjectHandle::operator=((QPDFObjectHandle *)this,(QPDFObjectHandle *)&__range3);
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)&__range3);
    QPDFObjectHandle::as_array((Array *)&__begin3,(QPDFObjectHandle *)obj_copier,any);
    __end3 = ::qpdf::Array::begin((Array *)&__begin3);
    item = (QPDFObjectHandle *)::qpdf::Array::end((Array *)&__begin3);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<QPDFObjectHandle_*,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>
                                       *)&item), bVar2) {
      local_b8 = (_Base_ptr)
                 __gnu_cxx::
                 __normal_iterator<QPDFObjectHandle_*,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>
                 ::operator*(&__end3);
      QPDFObjectHandle::QPDFObjectHandle((QPDFObjectHandle *)local_d8,(QPDFObjectHandle *)local_b8);
      replaceForeignIndirectObjects((QPDF *)(local_d8 + 0x10),foreign,(ObjCopier *)local_d8,top);
      QPDFObjectHandle::appendItem((QPDFObjectHandle *)this,(QPDFObjectHandle *)(local_d8 + 0x10));
      QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)(local_d8 + 0x10));
      QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_d8);
      __gnu_cxx::
      __normal_iterator<QPDFObjectHandle_*,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>
      ::operator++(&__end3);
    }
    ::qpdf::Array::~Array((Array *)&__begin3);
    _Var6._M_pi = extraout_RDX_01;
  }
  else if (qVar3 == ot_dictionary) {
    QTC::TC("qpdf","QPDF replace dictionary",0);
    QPDFObjectHandle::newDictionary();
    QPDFObjectHandle::operator=((QPDFObjectHandle *)this,(QPDFObjectHandle *)&__range4);
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)&__range4);
    QPDFObjectHandle::as_dictionary((QPDFObjectHandle *)&__begin4,(typed)obj_copier);
    __end4 = ::qpdf::BaseDictionary::begin_abi_cxx11_((BaseDictionary *)&__begin4);
    local_110._M_node =
         (_Base_ptr)::qpdf::BaseDictionary::end_abi_cxx11_((BaseDictionary *)&__begin4);
    while (bVar2 = std::operator!=(&__end4,&local_110), bVar2) {
      key = &std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>
             ::operator*(&__end4)->first;
      value = (type *)std::get<0ul,std::__cxx11::string_const,QPDFObjectHandle>
                                ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>
                                  *)key);
      local_128 = (_Base_ptr)
                  std::get<1ul,std::__cxx11::string_const,QPDFObjectHandle>
                            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>
                              *)key);
      bVar2 = ::qpdf::BaseHandle::null((BaseHandle *)local_128);
      ptVar1 = value;
      if (!bVar2) {
        QPDFObjectHandle::QPDFObjectHandle
                  ((QPDFObjectHandle *)local_148,(QPDFObjectHandle *)local_128);
        replaceForeignIndirectObjects((QPDF *)(local_148 + 0x10),foreign,(ObjCopier *)local_148,top)
        ;
        QPDFObjectHandle::replaceKey
                  ((QPDFObjectHandle *)this,(string *)ptVar1,(QPDFObjectHandle *)(local_148 + 0x10))
        ;
        QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)(local_148 + 0x10));
        QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_148);
      }
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>
      ::operator++(&__end4);
    }
    ::qpdf::Dictionary::~Dictionary((Dictionary *)&__begin4);
    _Var6._M_pi = extraout_RDX_02;
  }
  else if (qVar3 == ot_stream) {
    QTC::TC("qpdf","QPDF replace stream",0);
    dict.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
    ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             QPDFObjectHandle::getObjGen((QPDFObjectHandle *)obj_copier);
    pmVar5 = std::
             map<QPDFObjGen,_QPDFObjectHandle,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFObjectHandle>_>_>
             ::operator[](this_01,(key_type *)
                                  &dict.super_BaseHandle.obj.
                                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_refcount);
    QPDFObjectHandle::operator=((QPDFObjectHandle *)this,pmVar5);
    QPDFObjectHandle::getDict
              ((QPDFObjectHandle *)
               &old_dict.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    QPDFObjectHandle::getDict((QPDFObjectHandle *)&__range5);
    QPDFObjectHandle::as_dictionary((QPDFObjectHandle *)&__begin5,(typed)&__range5);
    __end5 = ::qpdf::BaseDictionary::begin_abi_cxx11_((BaseDictionary *)&__begin5);
    local_198._M_node =
         (_Base_ptr)::qpdf::BaseDictionary::end_abi_cxx11_((BaseDictionary *)&__begin5);
    while (bVar2 = std::operator!=(&__end5,&local_198), bVar2) {
      key_1 = &std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>
               ::operator*(&__end5)->first;
      value_1 = (type *)std::get<0ul,std::__cxx11::string_const,QPDFObjectHandle>
                                  ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>
                                    *)key_1);
      local_1b0 = (_Base_ptr)
                  std::get<1ul,std::__cxx11::string_const,QPDFObjectHandle>
                            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>
                              *)key_1);
      bVar2 = ::qpdf::BaseHandle::null((BaseHandle *)local_1b0);
      ptVar1 = value_1;
      if (!bVar2) {
        QPDFObjectHandle::QPDFObjectHandle
                  ((QPDFObjectHandle *)local_1d0,(QPDFObjectHandle *)local_1b0);
        replaceForeignIndirectObjects((QPDF *)(local_1d0 + 0x10),foreign,(ObjCopier *)local_1d0,top)
        ;
        QPDFObjectHandle::replaceKey
                  ((QPDFObjectHandle *)
                   &old_dict.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                   (string *)ptVar1,(QPDFObjectHandle *)(local_1d0 + 0x10));
        QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)(local_1d0 + 0x10));
        QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_1d0);
      }
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>
      ::operator++(&__end5);
    }
    ::qpdf::Dictionary::~Dictionary((Dictionary *)&__begin5);
    QPDFObjectHandle::QPDFObjectHandle(&local_1e0,(QPDFObjectHandle *)this);
    QPDFObjectHandle::QPDFObjectHandle(&local_1f0,(QPDFObjectHandle *)obj_copier);
    copyStreamData((QPDF *)foreign,&local_1e0,&local_1f0);
    QPDFObjectHandle::~QPDFObjectHandle(&local_1f0);
    QPDFObjectHandle::~QPDFObjectHandle(&local_1e0);
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)&__range5);
    QPDFObjectHandle::~QPDFObjectHandle
              ((QPDFObjectHandle *)
               &old_dict.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    _Var6._M_pi = extraout_RDX_03;
  }
  else {
    QPDFObjectHandle::assertScalar((QPDFObjectHandle *)obj_copier);
    QPDFObjectHandle::operator=((QPDFObjectHandle *)this,(QPDFObjectHandle *)obj_copier);
    QPDFObjectHandle::makeDirect((QPDFObjectHandle *)this,false);
    _Var6._M_pi = extraout_RDX_04;
  }
  if ((((in_R8B & 1) != 0) &&
      (bVar2 = QPDFObjectHandle::isStream((QPDFObjectHandle *)this), _Var6._M_pi = extraout_RDX_05,
      !bVar2)) &&
     (bVar2 = QPDFObjectHandle::isIndirect((QPDFObjectHandle *)this), _Var6._M_pi = extraout_RDX_06,
     bVar2)) {
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this_00,"replacement for foreign object is indirect");
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  QVar7.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var6._M_pi;
  QVar7.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (QPDFObjectHandle)
         QVar7.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

QPDFObjectHandle
QPDF::replaceForeignIndirectObjects(QPDFObjectHandle foreign, ObjCopier& obj_copier, bool top)
{
    auto foreign_tc = foreign.getTypeCode();
    QPDFObjectHandle result;
    if ((!top) && foreign.isIndirect()) {
        QTC::TC("qpdf", "QPDF replace indirect");
        auto mapping = obj_copier.object_map.find(foreign.getObjGen());
        if (mapping == obj_copier.object_map.end()) {
            // This case would occur if this is a reference to a Pages object that we didn't
            // traverse into.
            QTC::TC("qpdf", "QPDF replace foreign indirect with null");
            result = QPDFObjectHandle::newNull();
        } else {
            result = mapping->second;
        }
    } else if (foreign_tc == ::ot_array) {
        QTC::TC("qpdf", "QPDF replace array");
        result = QPDFObjectHandle::newArray();
        for (auto const& item: foreign.as_array()) {
            result.appendItem(replaceForeignIndirectObjects(item, obj_copier, false));
        }
    } else if (foreign_tc == ::ot_dictionary) {
        QTC::TC("qpdf", "QPDF replace dictionary");
        result = QPDFObjectHandle::newDictionary();
        for (auto const& [key, value]: foreign.as_dictionary()) {
            if (!value.null()) {
                result.replaceKey(key, replaceForeignIndirectObjects(value, obj_copier, false));
            }
        }
    } else if (foreign_tc == ::ot_stream) {
        QTC::TC("qpdf", "QPDF replace stream");
        result = obj_copier.object_map[foreign.getObjGen()];
        QPDFObjectHandle dict = result.getDict();
        QPDFObjectHandle old_dict = foreign.getDict();
        for (auto const& [key, value]: old_dict.as_dictionary()) {
            if (!value.null()) {
                dict.replaceKey(key, replaceForeignIndirectObjects(value, obj_copier, false));
            }
        }
        copyStreamData(result, foreign);
    } else {
        foreign.assertScalar();
        result = foreign;
        result.makeDirect();
    }

    if (top && (!result.isStream()) && result.isIndirect()) {
        throw std::logic_error("replacement for foreign object is indirect");
    }

    return result;
}